

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comoment_suite.cpp
# Opt level: O0

void double_suite::test_same_increment_by_one(void)

{
  close_to<double> predicate;
  close_to<double> predicate_00;
  close_to<double> predicate_01;
  close_to<double> predicate_02;
  close_to<double> predicate_03;
  close_to<double> predicate_04;
  close_to<double> predicate_05;
  close_to<double> predicate_06;
  double absolute_tolerance;
  double *in_stack_fffffffffffffe48;
  double local_1a8;
  value_type local_1a0;
  value_type local_198;
  double local_188;
  value_type local_180;
  value_type local_178;
  double local_168;
  value_type local_160;
  value_type local_158;
  double local_148;
  value_type local_140;
  value_type local_138;
  double local_128;
  value_type local_120;
  value_type local_118;
  double local_108;
  value_type local_100;
  value_type local_f8;
  double local_e8;
  value_type local_e0;
  value_type local_d8;
  double local_c8;
  value_type local_c0 [4];
  undefined8 local_a0;
  value_type local_98 [2];
  undefined1 local_88 [8];
  covariance<double,_4> filter;
  close_to<double> tolerance;
  
  absolute_tolerance = std::numeric_limits<double>::min();
  trial::online::detail::close_to<double>::close_to
            ((close_to<double> *)&filter.sum.xy,1e-06,absolute_tolerance);
  trial::online::window::basic_comoment<double,_4UL,_(trial::online::with)2>::basic_comoment
            ((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_88);
  trial::online::window::basic_comoment<double,_4UL,_(trial::online::with)2>::push
            ((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_88,1.0,1.0);
  local_98[0] = trial::online::window::basic_comoment<double,_4UL,_(trial::online::with)2>::variance
                          ((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_88);
  local_a0 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.variance()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/comoment_suite.cpp"
             ,0x117,"void double_suite::test_same_increment_by_one()",local_98,&local_a0);
  local_c0[2] = trial::online::window::basic_comoment<double,_4UL,_(trial::online::with)2>::
                unbiased_variance((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_88);
  local_c0[1] = 0.0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.unbiased_variance()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/comoment_suite.cpp"
             ,0x118,"void double_suite::test_same_increment_by_one()",local_c0 + 2,local_c0 + 1);
  trial::online::window::basic_comoment<double,_4UL,_(trial::online::with)2>::push
            ((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_88,2.0,2.0);
  local_c0[0] = trial::online::window::basic_comoment<double,_4UL,_(trial::online::with)2>::variance
                          ((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_88);
  local_c8 = 0.25;
  local_d8 = filter.sum.xy;
  predicate_06.absolute = tolerance.relative;
  predicate_06.relative = filter.sum.xy;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","0.25","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/comoment_suite.cpp"
             ,(char *)0x11a,0x10b460,(char *)local_c0,&local_c8,in_stack_fffffffffffffe48,
             predicate_06);
  local_e0 = trial::online::window::basic_comoment<double,_4UL,_(trial::online::with)2>::
             unbiased_variance((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_88);
  local_e8 = 0.5;
  local_f8 = filter.sum.xy;
  predicate_05.absolute = tolerance.relative;
  predicate_05.relative = filter.sum.xy;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.unbiased_variance()","0.5","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/comoment_suite.cpp"
             ,(char *)0x11b,0x10b460,(char *)&local_e0,&local_e8,in_stack_fffffffffffffe48,
             predicate_05);
  trial::online::window::basic_comoment<double,_4UL,_(trial::online::with)2>::push
            ((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_88,3.0,3.0);
  local_100 = trial::online::window::basic_comoment<double,_4UL,_(trial::online::with)2>::variance
                        ((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_88);
  local_108 = 0.666667;
  local_118 = filter.sum.xy;
  predicate_04.absolute = tolerance.relative;
  predicate_04.relative = filter.sum.xy;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","0.666667","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/comoment_suite.cpp"
             ,(char *)0x11d,0x10b460,(char *)&local_100,&local_108,in_stack_fffffffffffffe48,
             predicate_04);
  local_120 = trial::online::window::basic_comoment<double,_4UL,_(trial::online::with)2>::
              unbiased_variance((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_88);
  local_128 = 1.0;
  local_138 = filter.sum.xy;
  predicate_03.absolute = tolerance.relative;
  predicate_03.relative = filter.sum.xy;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.unbiased_variance()","1.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/comoment_suite.cpp"
             ,(char *)0x11e,0x10b460,(char *)&local_120,&local_128,in_stack_fffffffffffffe48,
             predicate_03);
  trial::online::window::basic_comoment<double,_4UL,_(trial::online::with)2>::push
            ((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_88,4.0,4.0);
  local_140 = trial::online::window::basic_comoment<double,_4UL,_(trial::online::with)2>::variance
                        ((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_88);
  local_148 = 1.25;
  local_158 = filter.sum.xy;
  predicate_02.absolute = tolerance.relative;
  predicate_02.relative = filter.sum.xy;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","1.25","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/comoment_suite.cpp"
             ,(char *)0x120,0x10b460,(char *)&local_140,&local_148,in_stack_fffffffffffffe48,
             predicate_02);
  local_160 = trial::online::window::basic_comoment<double,_4UL,_(trial::online::with)2>::
              unbiased_variance((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_88);
  local_168 = 1.666667;
  local_178 = filter.sum.xy;
  predicate_01.absolute = tolerance.relative;
  predicate_01.relative = filter.sum.xy;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.unbiased_variance()","1.666667","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/comoment_suite.cpp"
             ,(char *)0x121,0x10b460,(char *)&local_160,&local_168,in_stack_fffffffffffffe48,
             predicate_01);
  trial::online::window::basic_comoment<double,_4UL,_(trial::online::with)2>::push
            ((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_88,5.0,5.0);
  local_180 = trial::online::window::basic_comoment<double,_4UL,_(trial::online::with)2>::variance
                        ((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_88);
  local_188 = 1.25;
  local_198 = filter.sum.xy;
  predicate_00.absolute = tolerance.relative;
  predicate_00.relative = filter.sum.xy;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","1.25","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/comoment_suite.cpp"
             ,(char *)0x124,0x10b460,(char *)&local_180,&local_188,in_stack_fffffffffffffe48,
             predicate_00);
  local_1a0 = trial::online::window::basic_comoment<double,_4UL,_(trial::online::with)2>::
              unbiased_variance((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_88);
  local_1a8 = 1.666667;
  predicate.absolute = tolerance.relative;
  predicate.relative = filter.sum.xy;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.unbiased_variance()","1.666667","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/comoment_suite.cpp"
             ,(char *)0x125,0x10b460,(char *)&local_1a0,&local_1a8,(double *)filter.sum.xy,predicate
            );
  return;
}

Assistant:

void test_same_increment_by_one()
{
    const auto tolerance = detail::close_to<double>(1e-6);
    window::covariance<double, 4> filter;
    filter.push(1.0, 1.0);
    TRIAL_TEST_EQ(filter.variance(), 0.0);
    TRIAL_TEST_EQ(filter.unbiased_variance(), 0.0);
    filter.push(2.0, 2.0);
    TRIAL_TEST_WITH(filter.variance(), 0.25, tolerance);
    TRIAL_TEST_WITH(filter.unbiased_variance(), 0.5, tolerance);
    filter.push(3.0, 3.0);
    TRIAL_TEST_WITH(filter.variance(), 0.666667, tolerance);
    TRIAL_TEST_WITH(filter.unbiased_variance(), 1.0, tolerance);
    filter.push(4.0, 4.0);
    TRIAL_TEST_WITH(filter.variance(), 1.25, tolerance);
    TRIAL_TEST_WITH(filter.unbiased_variance(), 1.666667, tolerance);
    // Window full
    filter.push(5.0, 5.0);
    TRIAL_TEST_WITH(filter.variance(), 1.25, tolerance);
    TRIAL_TEST_WITH(filter.unbiased_variance(), 1.666667, tolerance);
}